

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
          (mapping<std::_List_iterator<wchar_t>_> *this,boundary_type type,base_iterator begin,
          base_iterator end,locale *loc)

{
  shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  *this_00;
  pointer in_RCX;
  pointer in_RDX;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *in_RDI;
  locale *in_stack_00000010;
  boundary_type in_stack_0000001c;
  _List_iterator<wchar_t> in_stack_00000020;
  _List_iterator<wchar_t> in_stack_00000028;
  index_type idx;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *__x;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *in_stack_ffffffffffffffa0;
  
  __x = in_RDI;
  this_00 = (shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
             *)operator_new(0x18);
  (this_00->
  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  (this_00->
  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00[1].
  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)0x161a1f);
  std::
  shared_ptr<std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>>
  ::
  shared_ptr<std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>,void>
            (this_00,in_RDI);
  (__x->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  __x[1].
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RCX;
  mapping_traits<std::_List_iterator<wchar_t>,_std::bidirectional_iterator_tag>::map
            (in_stack_0000001c,in_stack_00000028,in_stack_00000020,in_stack_00000010);
  std::
  __shared_ptr_access<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x161a81);
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::swap(in_stack_ffffffffffffffa0,__x);
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::~vector(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

mapping(boundary_type type,
                            base_iterator begin,
                            base_iterator end,
                            std::locale const &loc) 
                        :   
                            index_(new index_type()),
                            begin_(begin),
                            end_(end)
                    {
                        index_type idx=details::mapping_traits<base_iterator>::map(type,begin,end,loc);
                        index_->swap(idx);
                    }